

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::ThreadOpenAddedConnections(CConnman *this)

{
  CThreadInterrupt *this_00;
  long lVar1;
  CService ipIn;
  pointer pAVar2;
  bool bVar3;
  pointer pAVar4;
  duration rel_time;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff18;
  undefined1 auStack_e4 [12];
  vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> vInfo;
  CSemaphoreGrant local_b8;
  CSemaphoreGrant grant;
  CService local_98;
  CAddress addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->interruptNet;
  do {
    grant.sem = (this->semAddnode)._M_t.
                super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
    grant.fHaveGrant = false;
    CSemaphoreGrant::Acquire(&grant);
    GetAddedNodeInfo(&vInfo,this,false);
    pAVar2 = vInfo.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    rel_time.__r = 2000000000;
    pAVar4 = vInfo.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    while ((pAVar4 != pAVar2 && (grant.fHaveGrant == true))) {
      CService::CService(&local_98);
      ipIn.super_CNetAddr.m_addr._union._4_12_ = auStack_e4;
      ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_ffffffffffffff18;
      ipIn.super_CNetAddr.m_addr._16_8_ = this_00;
      ipIn.super_CNetAddr._24_8_ =
           vInfo.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
      ipIn._32_8_ = vInfo.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_98);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
      bVar3 = (pAVar4->m_params).m_use_v2transport;
      in_stack_ffffffffffffff18 = (uint)bVar3;
      OpenNetworkConnection
                (this,&addr,false,&grant,(pAVar4->m_params).m_added_node._M_dataplus._M_p,MANUAL,
                 bVar3);
      bVar3 = CThreadInterrupt::sleep_for(this_00,(duration)0x1dcd6500);
      if (!bVar3) {
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
        std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector(&vInfo);
        CSemaphoreGrant::Release(&grant);
        goto LAB_0071250b;
      }
      local_b8.sem = (this->semAddnode)._M_t.
                     super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                     super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                     super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
      local_b8.fHaveGrant = false;
      CSemaphoreGrant::TryAcquire(&local_b8);
      CSemaphoreGrant::operator=(&grant,&local_b8);
      CSemaphoreGrant::Release(&local_b8);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
      pAVar4 = pAVar4 + 1;
      rel_time.__r = 60000000000;
    }
    PerformReconnections(this);
    bVar3 = CThreadInterrupt::sleep_for(this_00,rel_time);
    std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector(&vInfo);
    CSemaphoreGrant::Release(&grant);
  } while (bVar3);
LAB_0071250b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadOpenAddedConnections()
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    while (true)
    {
        CSemaphoreGrant grant(*semAddnode);
        std::vector<AddedNodeInfo> vInfo = GetAddedNodeInfo(/*include_connected=*/false);
        bool tried = false;
        for (const AddedNodeInfo& info : vInfo) {
            if (!grant) {
                // If we've used up our semaphore and need a new one, let's not wait here since while we are waiting
                // the addednodeinfo state might change.
                break;
            }
            tried = true;
            CAddress addr(CService(), NODE_NONE);
            OpenNetworkConnection(addr, false, std::move(grant), info.m_params.m_added_node.c_str(), ConnectionType::MANUAL, info.m_params.m_use_v2transport);
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500))) return;
            grant = CSemaphoreGrant(*semAddnode, /*fTry=*/true);
        }
        // See if any reconnections are desired.
        PerformReconnections();
        // Retry every 60 seconds if a connection was attempted, otherwise two seconds
        if (!interruptNet.sleep_for(std::chrono::seconds(tried ? 60 : 2)))
            return;
    }
}